

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall
cashew::ValueBuilder::appendToObjectAsGetter(ValueBuilder *this,Ref array,IString key,Ref value)

{
  Value *this_00;
  char *pcVar1;
  char cVar2;
  Ref *this_01;
  undefined8 *puVar3;
  Value *pVVar4;
  Value *pVVar5;
  Ref RVar6;
  void *pvVar7;
  ValueBuilder *local_60;
  Ref array_local;
  
  array_local.inst = (Value *)key.str._M_str;
  local_60 = this;
  this_01 = (Ref *)cashew::Ref::operator[]((uint)&local_60);
  cVar2 = cashew::Ref::operator==(this_01,(IString *)&OBJECT);
  if (cVar2 != '\0') {
    puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_60);
    this_00 = (Value *)*puVar3;
    pVVar4 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar4->type = Null;
    pVVar4 = Value::setArray(pVVar4,2);
    pVVar5 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar5->type = Null;
    pVVar5 = Value::setArray(pVVar5,2);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar6.inst)->type = Null;
    Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    pcVar1 = _finalize;
    ((RVar6.inst)->field_1).str.str._M_len = GETTER;
    ((RVar6.inst)->field_1).str.str._M_str = pcVar1;
    pVVar5 = Value::push_back(pVVar5,RVar6);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar6.inst)->type = Null;
    Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    ((RVar6.inst)->field_1).ref.inst = array.inst;
    ((RVar6.inst)->field_1).str.str._M_str = (char *)key.str._M_len;
    RVar6.inst = Value::push_back(pVVar5,RVar6);
    pVVar4 = Value::push_back(pVVar4,RVar6);
    RVar6.inst = Value::push_back(pVVar4,array_local);
    Value::push_back(this_00,RVar6);
    return;
  }
  __assert_fail("array[0] == OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x738,"static void cashew::ValueBuilder::appendToObjectAsGetter(Ref, IString, Ref)"
               );
}

Assistant:

static void appendToObjectAsGetter(Ref array, IString key, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(2)
                                          ->push_back(makeRawString(GETTER))
                                          .push_back(makeRawString(key)))
                           .push_back(value));
  }